

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX
               (wchar_t *label,wchar_t nlabel,wchar_t *vals,wchar_t *auxvals,wchar_t n,
               ui_entry_details *details,renderer_info *info)

{
  wchar_t x;
  wchar_t y;
  ui_entry_details *puVar1;
  wchar_t n_00;
  wchar_t *pwVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  loc_conflict lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  wchar_t ac;
  ui_entry_combiner_funcs_conflict combiner;
  ui_entry_combiner_state_conflict cst;
  wchar_t local_94;
  wchar_t local_90;
  wchar_t local_8c;
  wchar_t *local_88;
  ui_entry_details *local_80;
  wchar_t local_74;
  wchar_t *local_70;
  ui_entry_combiner_funcs local_68;
  ulong local_48;
  ui_entry_combiner_state local_40;
  
  uVar10 = 7;
  if (details->alternate_color_first == false) {
    uVar10 = 0;
  }
  local_88 = auxvals;
  if (((L'\x15' < info->ncolors) && (L'\t' < info->nlabcolors)) && (L'\n' < info->nsym)) {
    lVar6.y = 0;
    lVar6.x = (details->value_position).x;
    uVar8 = (ulong)(uint)(details->value_position).y;
    local_80 = details;
    local_74 = nlabel;
    local_70 = label;
    iVar3 = ui_entry_combiner_get_funcs(info->combiner_index,&local_68);
    if (iVar3 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                    ,0x43f,
                    "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
                   );
    }
    local_90 = n;
    if (L'\0' < n) {
      local_48 = (ulong)(uint)n;
      uVar9 = 0;
      do {
        (*local_68.init_func)(vals[uVar9],0,&local_40);
        (*local_68.accum_func)(local_88[uVar9],0,&local_40);
        (*local_68.finish_func)(&local_40);
        uVar5 = 0;
        if (((vals[uVar9] != L'\x7fffffff') &&
            ((vals[uVar9] != L'\0' || (uVar5 = 0, local_88[uVar9] != L'\x7fffffff')))) &&
           (uVar5 = 1, local_40.accum != 0x7ffffffe)) {
          iVar3 = (uint)(local_88[uVar9] != L'\0') * 2;
          if (L'\0' < local_88[uVar9]) {
            iVar3 = 1;
          }
          iVar4 = 8;
          if (local_40.accum == 0) {
            iVar4 = 2;
          }
          if (0 < local_40.accum) {
            iVar4 = 5;
          }
          uVar5 = iVar4 + iVar3;
        }
        Term_putch(lVar6.x,(wchar_t)uVar8,info->colors[uVar5 + uVar10],info->symbols[uVar5]);
        lVar6 = loc_sum((loc_conflict)((ulong)lVar6 & 0xffffffff | uVar8 << 0x20),
                        (loc_conflict)local_80->position_step);
        uVar8 = (ulong)lVar6 >> 0x20;
        uVar10 = uVar10 ^ 0xb;
        uVar9 = uVar9 + 1;
      } while (local_48 != uVar9);
    }
    n_00 = local_74;
    if (local_74 < L'\x01') {
      if (local_80->show_combined != true) {
        return;
      }
      (*local_68.vec_func)(local_90,vals,local_88,&local_8c,&local_94);
    }
    else {
      (*local_68.vec_func)(local_90,vals,local_88,&local_8c,&local_94);
      puVar1 = local_80;
      if (local_80->known_rune == true) {
        (*local_68.init_func)(local_8c,0,&local_40);
        (*local_68.accum_func)(local_94,0,&local_40);
        (*local_68.finish_func)(&local_40);
        lVar11 = 1;
        if (local_40.accum < 0x7ffffffe) {
          uVar8 = (ulong)((uint)(local_94 != L'\0') * 2);
          if (L'\0' < local_94) {
            uVar8 = 1;
          }
          lVar7 = 7;
          if (local_40.accum == 0) {
            lVar7 = 1;
          }
          lVar11 = 4;
          if (local_40.accum < 1) {
            lVar11 = lVar7;
          }
          lVar11 = lVar11 + uVar8;
        }
      }
      else {
        lVar11 = 0;
      }
      pwVar2 = local_70;
      x = (puVar1->label_position).x;
      y = (puVar1->label_position).y;
      if (puVar1->vertical_label == true) {
        uVar8 = 0;
        do {
          Term_putch(x,y + (int)uVar8,info->label_colors[lVar11],pwVar2[uVar8]);
          uVar8 = uVar8 + 1;
        } while ((uint)n_00 != uVar8);
      }
      else {
        safe_queue_chars(x,y,n_00,info->label_colors[lVar11],local_70);
      }
    }
    if (local_80->show_combined == true) {
      show_combined_generic(info,local_80,local_8c,local_94);
    }
    return;
  }
  __assert_fail("info->ncolors >= 22 && info->nlabcolors >= 10 && info->nsym >= 11",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry-renderers.c"
                ,0x43c,
                "void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(const wchar_t *, int, const int *, const int *, int, const struct ui_entry_details *, const struct renderer_info *)"
               );
}

Assistant:

static void renderer_NUMERIC_AS_SIGN_RENDERER_WITH_COMBINED_AUX(
	const wchar_t *label,
	int nlabel,
	const int *vals,
	const int *auxvals,
	int n,
	const struct ui_entry_details *details,
	const struct renderer_info *info)
{
	struct loc p = details->value_position;
	int color_offset = (details->alternate_color_first) ? 7 : 0;
	struct ui_entry_combiner_funcs combiner;
	int vc, ac;
	int i;

	/* Check for defaults that are too short in list-ui-entry-renders.h. */
	assert(info->ncolors >= 22 && info->nlabcolors >= 10
		&& info->nsym >= 11);

	if (ui_entry_combiner_get_funcs(info->combiner_index, &combiner)) {
		assert(0);
	}

	for (i = 0; i < n; ++i) {
		struct ui_entry_combiner_state cst;
		int palette_index;

		(*combiner.init_func)(vals[i], 0, &cst);
		(*combiner.accum_func)(auxvals[i], 0, &cst);
		(*combiner.finish_func)(&cst);
		if (vals[i] == UI_ENTRY_UNKNOWN_VALUE || (vals[i] == 0
				&& auxvals[i] == UI_ENTRY_UNKNOWN_VALUE)) {
			palette_index = 0;
		} else if (cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			palette_index = 1;
		} else {
			palette_index =
				((cst.accum > 0) ?
					5 : ((cst.accum < 0) ? 8 : 2))
				+ ((auxvals[i] > 0) ?
					1 : ((auxvals[i] < 0) ? 2 : 0));
		}
		Term_putch(p.x, p.y,
			info->colors[palette_index + color_offset],
			info->symbols[palette_index]);
		p = loc_sum(p, details->position_step);
		color_offset ^= 11;
	}

	if (nlabel <= 0 && !details->show_combined) {
		return;
	}

	(*combiner.vec_func)(n, vals, auxvals, &vc, &ac);

	if (nlabel > 0) {
		int palette_index;

		if (!details->known_rune) {
			palette_index = 0;
		} else {
			struct ui_entry_combiner_state cst;

			(*combiner.init_func)(vc, 0, &cst);
			(*combiner.accum_func)(ac, 0, &cst);
			(*combiner.finish_func)(&cst);
			if (cst.accum == UI_ENTRY_UNKNOWN_VALUE
					|| cst.accum == UI_ENTRY_VALUE_NOT_PRESENT) {
				palette_index = 1;
			} else {
				palette_index =
					((cst.accum > 0) ? 4 :
						((cst.accum < 0) ? 7 : 1))
					+ ((ac > 0) ? 1 : ((ac < 0) ? 2 : 0));
			}
		}
		if (details->vertical_label) {
			p = details->label_position;
			for (i = 0; i < nlabel; ++i) {
				Term_putch(p.x, p.y,
					info->label_colors[palette_index],
					label[i]);
				p.y += 1;
			}
		} else {
			safe_queue_chars(details->label_position.x,
				details->label_position.y, nlabel,
				info->label_colors[palette_index], label);
		}
	}

	if (details->show_combined) {
		show_combined_generic(info, details, vc, ac);
	}
}